

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O1

size_t tinyusdz::Usd_IntegerCompression64::DecompressFromBuffer
                 (char *compressed,size_t compressedSize,uint64_t *ints,size_t numInts,string *err,
                 char *workingSpace)

{
  byte bVar1;
  long lVar2;
  size_t sVar3;
  int iVar4;
  uint64_t uVar5;
  ulong maxOutputSize;
  long *plVar6;
  uint uVar7;
  long lVar8;
  byte *pbVar9;
  long *local_40;
  
  if (numInts == 0) {
    maxOutputSize = 0;
  }
  else {
    maxOutputSize = (numInts * 2 + 7 >> 3) + numInts * 4 + 4;
  }
  if (workingSpace == (char *)0x0) {
    workingSpace = (char *)operator_new__(maxOutputSize);
    local_40 = (long *)workingSpace;
  }
  else {
    local_40 = (long *)0x0;
  }
  sVar3 = LZ4Compression::DecompressFromBuffer
                    (compressed,workingSpace,compressedSize,maxOutputSize,err);
  if (sVar3 == 0) {
    if (local_40 != (long *)0x0) {
      operator_delete__(local_40);
    }
    return 0;
  }
  lVar2 = *(long *)workingSpace;
  pbVar9 = (byte *)((long)workingSpace + 8);
  plVar6 = (long *)((long)workingSpace + (numInts * 2 + 7 >> 3) + 8);
  uVar5 = 0;
  if (3 < numInts) {
    do {
      bVar1 = *pbVar9;
      iVar4 = 0;
      do {
        uVar7 = (3 << ((byte)iVar4 & 0x1f) & (uint)bVar1) >> ((byte)iVar4 & 0x1f);
        if (uVar7 == 3) {
          lVar8 = *plVar6;
          plVar6 = plVar6 + 1;
        }
        else if (uVar7 == 2) {
          lVar8 = *plVar6;
          plVar6 = (long *)((long)plVar6 + 4);
          lVar8 = (long)(int)lVar8;
        }
        else {
          lVar8 = lVar2;
          if (uVar7 == 1) {
            lVar8 = *plVar6;
            plVar6 = (long *)((long)plVar6 + 2);
            lVar8 = (long)(short)lVar8;
          }
        }
        uVar5 = uVar5 + lVar8;
        *ints = uVar5;
        ints = ints + 1;
        iVar4 = iVar4 + 2;
      } while (iVar4 != 8);
      pbVar9 = pbVar9 + 1;
      numInts = numInts - 4;
    } while (3 < numInts);
  }
  sVar3 = (*(code *)(&DAT_0011262c + *(int *)(&DAT_0011262c + numInts * 4)))(local_40);
  return sVar3;
}

Assistant:

size_t
Usd_IntegerCompression64::DecompressFromBuffer(
    char const *compressed, size_t compressedSize,
    uint64_t *ints, size_t numInts, std::string *err, char *workingSpace)
{
    return _DecompressIntegers(compressed, compressedSize,
                               ints, numInts, err, workingSpace);
}